

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBoolReader.cpp
# Opt level: O0

void IBoolReader::getBlock(ifstream *ifs,string *str,string *blockName,bool type)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  int local_30;
  undefined4 local_2c;
  int i;
  int base_len;
  int num_3l;
  char tempChar;
  bool type_local;
  string *blockName_local;
  string *str_local;
  ifstream *ifs_local;
  
  base_len._3_1_ = type;
  _num_3l = blockName;
  blockName_local = str;
  str_local = (string *)ifs;
  local_2c = std::__cxx11::string::length();
  for (local_30 = 0; uVar3 = (ulong)local_30, uVar4 = std::__cxx11::string::length(),
      psVar1 = blockName_local, uVar3 < uVar4; local_30 = local_30 + 1) {
    base_len._2_1_ = std::istream::get();
    std::__cxx11::string::operator+=((string *)blockName_local,base_len._2_1_);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::length();
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
  bVar2 = std::operator!=(local_50,_num_3l);
  std::__cxx11::string::~string((string *)local_50);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)blockName_local);
    std::__cxx11::string::operator=((string *)blockName_local,local_70);
    std::__cxx11::string::~string(local_70);
  }
  else {
    while (base_len._2_1_ = std::istream::get(), base_len._2_1_ != -1) {
      std::__cxx11::string::operator+=((string *)blockName_local,base_len._2_1_);
      bVar2 = IDictionary::isBlankSep(base_len._2_1_);
      if (!bVar2) break;
      if (base_len._2_1_ == '\n') {
        std::__cxx11::string::operator+=((string *)blockName_local,'\n');
      }
    }
    if ((base_len._3_1_ & 1) != 0) {
      if (base_len._2_1_ != '(') {
        std::__cxx11::string::substr((ulong)local_90,(ulong)blockName_local);
        std::__cxx11::string::operator=((string *)blockName_local,local_90);
        std::__cxx11::string::~string(local_90);
        return;
      }
      do {
        base_len._2_1_ = std::istream::get();
        if (base_len._2_1_ == -1) break;
        std::__cxx11::string::operator+=((string *)blockName_local,base_len._2_1_);
      } while (base_len._2_1_ != ')');
      while( true ) {
        base_len._2_1_ = std::istream::get();
        bVar2 = IDictionary::isBlankSep(base_len._2_1_);
        if (!bVar2) break;
        std::__cxx11::string::operator+=((string *)blockName_local,base_len._2_1_);
        if (base_len._2_1_ == '\n') {
          std::__cxx11::string::operator+=((string *)blockName_local,'\n');
        }
      }
    }
    if (base_len._2_1_ == '{') {
      if ((base_len._3_1_ & 1) != 0) {
        std::__cxx11::string::operator+=((string *)blockName_local,'{');
      }
      i = 1;
      while (base_len._2_1_ = std::istream::get(), base_len._2_1_ != -1 && i != 0) {
        std::__cxx11::string::operator+=((string *)blockName_local,base_len._2_1_);
        if (base_len._2_1_ == '\n') {
          std::__cxx11::string::operator+=((string *)blockName_local,'\n');
        }
        else if (base_len._2_1_ == '}') {
          i = i + -1;
        }
      }
    }
    else if (base_len._2_1_ == ';') {
      std::__cxx11::string::operator+=((string *)blockName_local,';');
    }
    else {
      do {
        std::__cxx11::string::operator+=((string *)blockName_local,base_len._2_1_);
        base_len._2_1_ = std::istream::get();
      } while (base_len._2_1_ != ';');
    }
  }
  return;
}

Assistant:

void IBoolReader::getBlock(std::ifstream* ifs,std::string &str, const std::string &blockName, bool type) {
    char tempChar;
    int num_3l;
    int base_len = str.length();

    for(int i=0;i<blockName.length();i++)
    {
        tempChar=ifs->get();
        str+=tempChar;
    }
    if(str.substr(str.length()-blockName.length(),blockName.length())!=blockName) {
        str = str.substr(0,base_len);
        return;
    }

    while((tempChar=ifs->get())!=EOF)
    {
        str+=tempChar;
        if(!IDictionary::isBlankSep(tempChar))
            break;
        if(tempChar=='\n')
            str+='\n';
    }

    if(type)
    {
        if (tempChar != '(') {
            str = str.substr(0, base_len);
            return;
        }
        while ((tempChar = ifs->get()) != EOF) {
            str += tempChar;
            if (tempChar == ')')
                break;
        }
        while (true) {
            tempChar = ifs->get();
            if (IDictionary::isBlankSep(tempChar)) {
                str += tempChar;
                if (tempChar == '\n')
                    str += '\n';
            } else
                break;
        }
    }

    if(tempChar=='{')
    {
        if(type)
            str+=tempChar;
        num_3l=1;

        while ((tempChar=ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
    else if(tempChar==';')
    {
        str+=tempChar;
        return;
    }
    else
    {
        do{
            str+=tempChar;
            tempChar=ifs->get();
        }while (tempChar!=';');
    }
}